

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

CURLcode Curl_conncache_add_conn(conncache *connc,connectdata *conn)

{
  SessionHandle *data;
  char *__s;
  curl_hash *h;
  size_t sVar1;
  long lVar2;
  CURLcode CVar3;
  connectbundle *pcVar4;
  size_t sVar5;
  void *pvVar6;
  connectbundle *new_bundle;
  connectbundle *local_38;
  
  local_38 = (connectbundle *)0x0;
  data = conn->data;
  pcVar4 = Curl_conncache_find_bundle((data->state).conn_cache,(conn->host).name);
  if (pcVar4 == (connectbundle *)0x0) {
    CVar3 = Curl_bundle_create(data,&local_38);
    pcVar4 = local_38;
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    __s = (conn->host).name;
    h = ((data->state).conn_cache)->hash;
    sVar5 = strlen(__s);
    pvVar6 = Curl_hash_add(h,__s,sVar5 + 1,pcVar4);
    pcVar4 = local_38;
    if (pvVar6 == (void *)0x0) {
      Curl_bundle_destroy(local_38);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  CVar3 = Curl_bundle_add_conn(pcVar4,conn);
  if (CVar3 == CURLE_OK) {
    sVar1 = connc->num_connections;
    lVar2 = connc->next_connection_id;
    conn->connection_id = lVar2;
    connc->num_connections = sVar1 + 1;
    connc->next_connection_id = lVar2 + 1;
    CVar3 = CURLE_OK;
  }
  else if (local_38 != (connectbundle *)0x0) {
    conncache_remove_bundle((data->state).conn_cache,local_38);
  }
  return CVar3;
}

Assistant:

CURLcode Curl_conncache_add_conn(struct conncache *connc,
                                 struct connectdata *conn)
{
  CURLcode result;
  struct connectbundle *bundle;
  struct connectbundle *new_bundle = NULL;
  struct SessionHandle *data = conn->data;

  bundle = Curl_conncache_find_bundle(data->state.conn_cache,
                                      conn->host.name);
  if(!bundle) {
    result = Curl_bundle_create(data, &new_bundle);
    if(result != CURLE_OK)
      return result;

    if(!conncache_add_bundle(data->state.conn_cache,
                             conn->host.name, new_bundle)) {
      Curl_bundle_destroy(new_bundle);
      return CURLE_OUT_OF_MEMORY;
    }
    bundle = new_bundle;
  }

  result = Curl_bundle_add_conn(bundle, conn);
  if(result != CURLE_OK) {
    if(new_bundle)
      conncache_remove_bundle(data->state.conn_cache, new_bundle);
    return result;
  }

  conn->connection_id = connc->next_connection_id++;
  connc->num_connections++;

  return CURLE_OK;
}